

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O2

DdHashTable * cuddHashTableInit(DdManager *manager,uint keySize,uint initSize)

{
  int iVar1;
  DdHashTable *__ptr;
  DdHashItem **ppDVar2;
  uint uVar3;
  
  __ptr = (DdHashTable *)malloc(0x38);
  if (__ptr == (DdHashTable *)0x0) {
    manager->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    __ptr->keysize = keySize;
    __ptr->manager = manager;
    __ptr->nextFree = (DdHashItem *)0x0;
    __ptr->memoryList = (DdHashItem **)0x0;
    __ptr->itemsize = keySize * 8 + 0x18;
    if (initSize < 3) {
      initSize = 2;
    }
    iVar1 = cuddComputeFloorLog2(initSize);
    uVar3 = 1 << ((byte)iVar1 & 0x1f);
    __ptr->numBuckets = uVar3;
    __ptr->shift = 0x20 - iVar1;
    ppDVar2 = (DdHashItem **)calloc(1,(ulong)uVar3 << 3);
    __ptr->bucket = ppDVar2;
    if (ppDVar2 != (DdHashItem **)0x0) {
      __ptr->size = 0;
      __ptr->maxsize = 2 << ((byte)iVar1 & 0x1f);
      return __ptr;
    }
    manager->errorCode = CUDD_MEMORY_OUT;
    free(__ptr);
  }
  return (DdHashTable *)0x0;
}

Assistant:

DdHashTable *
cuddHashTableInit(
  DdManager * manager,
  unsigned int  keySize,
  unsigned int  initSize)
{
    DdHashTable *hash;
    int logSize;

#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    hash = ABC_ALLOC(DdHashTable, 1);
    if (hash == NULL) {
        manager->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    hash->keysize = keySize;
    hash->manager = manager;
    hash->memoryList = NULL;
    hash->nextFree = NULL;
    hash->itemsize = (keySize + 1) * sizeof(DdNode *) +
        sizeof(ptrint) + sizeof(DdHashItem *);
    /* We have to guarantee that the shift be < 32. */
    if (initSize < 2) initSize = 2;
    logSize = cuddComputeFloorLog2(initSize);
    hash->numBuckets = 1 << logSize;
    hash->shift = sizeof(int) * 8 - logSize;
    hash->bucket = ABC_ALLOC(DdHashItem *, hash->numBuckets);
    if (hash->bucket == NULL) {
        manager->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(hash);
        return(NULL);
    }
    memset(hash->bucket, 0, hash->numBuckets * sizeof(DdHashItem *));
    hash->size = 0;
    hash->maxsize = hash->numBuckets * DD_MAX_HASHTABLE_DENSITY;
#ifdef __osf__
#pragma pointer_size restore
#endif
    return(hash);

}